

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O1

Curl_tree * Curl_splaygetbest(timeval i,Curl_tree *t,Curl_tree **removed)

{
  long lVar1;
  __suseconds_t _Var2;
  Curl_tree *t_00;
  Curl_tree *pCVar3;
  long lVar4;
  
  lVar4 = i.tv_sec;
  if (t == (Curl_tree *)0x0) {
    t_00 = (Curl_tree *)0x0;
    pCVar3 = (Curl_tree *)0x0;
    goto LAB_0056a0f1;
  }
  t_00 = Curl_splay(i,t);
  lVar1 = (t_00->key).tv_sec;
  if ((lVar4 < lVar1) || ((lVar4 <= lVar1 && (i.tv_usec < (t_00->key).tv_usec)))) {
    pCVar3 = t_00;
    if (t_00->smaller != (Curl_tree *)0x0) {
      t_00 = Curl_splay(t_00->smaller->key,t_00);
      goto LAB_0056a08b;
    }
  }
  else {
LAB_0056a08b:
    lVar1 = (t_00->key).tv_sec;
    pCVar3 = t_00;
    if ((lVar1 <= lVar4) && ((lVar1 < lVar4 || ((t_00->key).tv_usec <= i.tv_usec)))) {
      pCVar3 = t_00->same;
      if (pCVar3 == (Curl_tree *)0x0) {
        if (t_00->smaller == (Curl_tree *)0x0) {
          pCVar3 = t_00->larger;
        }
        else {
          pCVar3 = Curl_splay(i,t_00->smaller);
          pCVar3->larger = t_00->larger;
        }
      }
      else {
        _Var2 = (t_00->key).tv_usec;
        (pCVar3->key).tv_sec = (t_00->key).tv_sec;
        (pCVar3->key).tv_usec = _Var2;
        pCVar3->larger = t_00->larger;
        pCVar3->smaller = t_00->smaller;
      }
      goto LAB_0056a0f1;
    }
  }
  t_00 = (Curl_tree *)0x0;
LAB_0056a0f1:
  *removed = t_00;
  return pCVar3;
}

Assistant:

struct Curl_tree *Curl_splaygetbest(struct timeval i,
                                    struct Curl_tree *t,
                                    struct Curl_tree **removed)
{
  struct Curl_tree *x;

  if(!t) {
    *removed = NULL; /* none removed since there was no root */
    return NULL;
  }

  t = Curl_splay(i, t);
  if(compare(i, t->key) < 0) {
    /* too big node, try the smaller chain */
    if(t->smaller)
      t=Curl_splay(t->smaller->key, t);
    else {
      /* fail */
      *removed = NULL;
      return t;
    }
  }

  if(compare(i, t->key) >= 0) {               /* found it */
    /* FIRST! Check if there is a list with identical keys */
    x = t->same;
    if(x) {
      /* there is, pick one from the list */

      /* 'x' is the new root node */

      x->key = t->key;
      x->larger = t->larger;
      x->smaller = t->smaller;

      *removed = t;
      return x; /* new root */
    }

    if(t->smaller == NULL) {
      x = t->larger;
    }
    else {
      x = Curl_splay(i, t->smaller);
      x->larger = t->larger;
    }
    *removed = t;

    return x;
  }
  else {
    *removed = NULL; /* no match */
    return t;        /* It wasn't there */
  }
}